

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::erase
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this,
          TypedID<(diligent_spirv_cross::Types)0> *start_erase,
          TypedID<(diligent_spirv_cross::Types)0> *end_erase)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar2;
  size_t new_size;
  TypedID<(diligent_spirv_cross::Types)0> *end_erase_local;
  TypedID<(diligent_spirv_cross::Types)0> *start_erase_local;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this_local;
  
  pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                     (&this->
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                     );
  if (end_erase == pTVar2) {
    pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::begin
                       (&this->
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                       );
    resize(this,(long)start_erase - (long)pTVar2 >> 2);
  }
  else {
    sVar1 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>)
            .buffer_size;
    pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                       (&this->
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                       );
    ::std::
    move<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*>
              (end_erase,pTVar2,start_erase);
    resize(this,sVar1 - ((long)end_erase - (long)start_erase >> 2));
  }
  return;
}

Assistant:

void erase(T *start_erase, T *end_erase) SPIRV_CROSS_NOEXCEPT
	{
		if (end_erase == this->end())
		{
			resize(size_t(start_erase - this->begin()));
		}
		else
		{
			auto new_size = this->buffer_size - (end_erase - start_erase);
			std::move(end_erase, this->end(), start_erase);
			resize(new_size);
		}
	}